

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Module *this_00;
  Index index_00;
  pointer pEVar1;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_d8;
  Location local_d0;
  Var local_b0;
  Export *local_68;
  Export *export_;
  undefined1 local_40 [8];
  __single_object field;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderIR *)name._M_len;
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_ = item_index;
  GetLocation((Location *)&export_,this);
  std::make_unique<wabt::ExportModuleField,wabt::Location>((Location *)local_40);
  pEVar1 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
           operator->((unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)local_40);
  local_68 = &pEVar1->export_;
  std::__cxx11::string::operator=
            ((string *)local_68,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  index_00 = field._M_t.
             super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
             .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
  GetLocation(&local_d0,this);
  Var::Var(&local_b0,index_00,&local_d0);
  Var::operator=(&local_68->var,&local_b0);
  Var::~Var(&local_b0);
  local_68->kind = kind;
  this_00 = this->module_;
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  unique_ptr(&local_d8,
             (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *)
             local_40);
  Module::AppendField(this_00,&local_d8);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr(&local_d8);
  Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *)
              local_40);
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                std::string_view name) {
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name;
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}